

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

RangeDimensionSpecifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RangeDimensionSpecifierSyntax,slang::syntax::SelectorSyntax&>
          (BumpAllocator *this,SelectorSyntax *args)

{
  RangeDimensionSpecifierSyntax *pRVar1;
  
  pRVar1 = (RangeDimensionSpecifierSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RangeDimensionSpecifierSyntax *)this->endPtr < pRVar1 + 1) {
    pRVar1 = (RangeDimensionSpecifierSyntax *)allocateSlow(this,0x18,8);
  }
  else {
    this->head->current = (byte *)(pRVar1 + 1);
  }
  (pRVar1->super_DimensionSpecifierSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pRVar1->super_DimensionSpecifierSyntax).super_SyntaxNode.kind = RangeDimensionSpecifier;
  (pRVar1->selector).ptr = args;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pRVar1;
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }